

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicGLSLConst::Run(BasicGLSLConst *this)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  GLuint GVar3;
  GLint GVar4;
  ShaderImageLoadStoreBase *this_01;
  GLenum GVar5;
  ivec4 *b;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  long lVar6;
  GLint i;
  string local_98;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> out_data;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  ShaderImageLoadStoreBase local_28 [16];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "\nlayout (local_size_x = 1) in;\nlayout(std430) buffer out_data {\n  ivec4 o_color;\n};\nuniform int MaxImageUnits;\nuniform int MaxCombinedShaderOutputResources;\nuniform int MaxVertexImageUniforms;\nuniform int MaxFragmentImageUniforms;\nuniform int MaxComputeImageUniforms;\nuniform int MaxCombinedImageUniforms;\nvoid main() {\n  o_color = ivec4(0, 1, 0, 1);\n  if (gl_MaxImageUnits != MaxImageUnits) o_color = ivec4(1, 0, 0, 1);\n  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = ivec4(1, 0, 0, 2);\n  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = ivec4(1, 0, 0, 4);\n  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = ivec4(1, 0, 0, 5);\n  if (gl_MaxComputeImageUniforms != MaxComputeImageUniforms) o_color = ivec4(1, 0, 0, 6);\n  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = ivec4(1, 0, 0, 9);\n}"
             ,(allocator<char> *)&local_58);
  GVar3 = ShaderImageLoadStoreBase::CreateComputeProgram
                    (&this->super_ShaderImageLoadStoreBase,&local_98,false);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&local_98);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f38,&i);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"MaxImageUnits");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,i);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f39,&i);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxCombinedShaderOutputResources");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,i);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ca,&i);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxVertexImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,i);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ce,&i);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxFragmentImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,i);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x91bd,&i);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxComputeImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,i);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90cf,&i);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxCombinedImageUniforms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,i);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&out_data,1,(allocator_type *)&local_98);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,0x10,
             out_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  GVar5 = 0x10;
  this_01 = (ShaderImageLoadStoreBase *)
            glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
  local_98._M_dataplus._M_p = (pointer)0x100000000;
  local_98._M_string_length = 0x100000000;
  bVar2 = ShaderImageLoadStoreBase::Equal(this_01,(ivec4 *)&local_98,b,GVar5);
  if (bVar2) {
    lVar6 = 0;
  }
  else {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_28,(Vector<int,_4> *)this_01);
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
              (&local_98,local_28,v);
    _Var1._M_p = local_98._M_dataplus._M_p;
    local_38 = 0x100000000;
    uStack_30 = 0x100000000;
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
              (&local_58,(ShaderImageLoadStoreBase *)&local_38,v_00);
    anon_unknown_0::Output
              ("[%d] Value is: %s. Value should be: %s.\n",(ulong)(uint)i,_Var1._M_p,
               local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    lVar6 = -1;
  }
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&out_data.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* src_cs =
			NL "layout (local_size_x = 1) in;" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color;" NL "};" NL
			   "uniform int MaxImageUnits;" NL "uniform int MaxCombinedShaderOutputResources;" NL
			   "uniform int MaxVertexImageUniforms;" NL "uniform int MaxFragmentImageUniforms;" NL
			   "uniform int MaxComputeImageUniforms;" NL "uniform int MaxCombinedImageUniforms;" NL "void main() {" NL
			   "  o_color = ivec4(0, 1, 0, 1);" NL
			   "  if (gl_MaxImageUnits != MaxImageUnits) o_color = ivec4(1, 0, 0, 1);" NL
			   "  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = ivec4(1, 0, "
			   "0, 2);" NL "  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = ivec4(1, 0, 0, 4);" NL
			   "  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = ivec4(1, 0, 0, 5);" NL
			   "  if (gl_MaxComputeImageUniforms != MaxComputeImageUniforms) o_color = ivec4(1, 0, 0, 6);" NL
			   "  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = ivec4(1, 0, 0, 9);" NL "}";
		m_program = CreateComputeProgram(src_cs);
		glUseProgram(m_program);

		GLint i;
		glGetIntegerv(GL_MAX_IMAGE_UNITS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxImageUnits"), i);

		glGetIntegerv(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedShaderOutputResources"), i);

		glGetIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxVertexImageUniforms"), i);

		glGetIntegerv(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxFragmentImageUniforms"), i);

		glGetIntegerv(GL_MAX_COMPUTE_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxComputeImageUniforms"), i);

		glGetIntegerv(GL_MAX_COMBINED_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedImageUniforms"), i);

		std::vector<ivec4> out_data(1);
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		ivec4* map_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * 4, GL_MAP_READ_BIT);

		if (!Equal(map_data[0], ivec4(0, 1, 0, 1), 0))
		{
			Output("[%d] Value is: %s. Value should be: %s.\n", i, ToString(map_data[0]).c_str(),
				   ToString(ivec4(0, 1, 0, 1)).c_str());
			return ERROR;
		}
		return NO_ERROR;
	}